

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O3

bool __thiscall duckdb_re2::Prog::IsOnePass(Prog *this)

{
  int iVar1;
  int iVar2;
  Inst *pIVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  long lVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  InstCond *pIVar11;
  int *__s;
  long lVar12;
  uchar *__dest;
  byte bVar13;
  _Head_base<0UL,_int_*,_false> _Var14;
  long lVar15;
  byte bVar16;
  int iVar17;
  _Tuple_impl<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter> _Var18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  size_type __n;
  uint uVar24;
  long lVar25;
  uint *puVar26;
  bool bVar27;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  Instq workq;
  Instq tovisit;
  ulong local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  int *local_210;
  long local_208;
  SparseSetT<void> local_200;
  SparseSetT<void> local_1d8;
  new_allocator<duckdb_re2::InstCond> local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->did_onepass_ == true) {
    bVar27 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t
             .super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      lVar25 = (long)this->inst_count_[2] + 2;
      lVar15 = this->dfa_mem_;
      lVar12 = lVar15 + 3;
      if (-1 < lVar15) {
        lVar12 = lVar15;
      }
      iVar1 = this->bytemap_range_ * 4 + 4;
      __n = (size_type)iVar1;
      auVar5._8_8_ = lVar12 >> 0x3f;
      auVar5._0_8_ = lVar12 >> 2;
      if (lVar25 <= SUB168(auVar5 / SEXT816((long)__n),0)) {
        pIVar11 = __gnu_cxx::new_allocator<duckdb_re2::InstCond>::allocate
                            (local_1b0,
                             (long)(this->inst_count_[3] + this->inst_count_[4] +
                                    this->inst_count_[6] + 1),(void *)0x0);
        iVar17 = this->size_;
        __s = __gnu_cxx::new_allocator<int>::allocate
                        ((new_allocator<int> *)local_1b0,(long)iVar17,(void *)0x0);
        switchD_00569a20::default(__s,0xff,(long)iVar17 * 4);
        local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&local_1d8,iVar17);
        SparseSetT<void>::SparseSetT(&local_200,iVar17);
        AddQ(&local_1d8,this->start_);
        __s[this->start_] = 0;
        local_1b0[0] = (new_allocator<duckdb_re2::InstCond>)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                  (&local_228,
                   (iterator)
                   local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__n,(value_type_conflict4 *)local_1b0);
        if (local_1d8.size_ == 0) {
          iVar17 = 1;
LAB_011cffbb:
          _Var18.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>.
          _M_head_impl.len_ =
               (_Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>)
               (iVar17 * iVar1);
          this->dfa_mem_ =
               this->dfa_mem_ -
               (long)(int)_Var18.
                          super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                          ._M_head_impl.len_;
          if ((int)_Var18.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                   ._M_head_impl.len_ < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (uchar *)operator_new((ulong)(uint)_Var18.
                                                  super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                                                  ._M_head_impl.len_);
          puVar4 = (this->onepass_nodes_).ptr_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest;
          if (puVar4 != (uchar *)0x0) {
            operator_delete(puVar4);
            __dest = (this->onepass_nodes_).ptr_._M_t.
                     super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
          super__Tuple_impl<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false> =
               _Var18.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>.
               _M_head_impl.len_;
          memmove(__dest,local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                  (long)(int)_Var18.
                             super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_char>::Deleter,_false>
                             ._M_head_impl.len_);
          bVar27 = true;
LAB_011d0013:
          SparseSetT<void>::~SparseSetT(&local_200);
          SparseSetT<void>::~SparseSetT(&local_1d8);
          if (local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_228.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (__s != (int *)0x0) {
            operator_delete(__s);
          }
          if (pIVar11 == (InstCond *)0x0) {
            return bVar27;
          }
          operator_delete(pIVar11);
          return bVar27;
        }
        iVar17 = 1;
        _Var14._M_head_impl =
             local_1d8.dense_.ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
LAB_011cfb98:
        iVar2 = *_Var14._M_head_impl;
        local_208 = (long)__s[iVar2] * __n;
        puVar26 = (uint *)(local_228.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + local_208);
        if (0 < this->bytemap_range_) {
          lVar15 = 0;
          do {
            puVar26[lVar15 + 1] = 0x30;
            lVar15 = lVar15 + 1;
          } while (lVar15 < this->bytemap_range_);
        }
        *puVar26 = 0x30;
        local_200.size_ = 0;
        pIVar11->id = iVar2;
        bVar27 = false;
        pIVar11->cond = 0;
        local_240 = 1;
        local_210 = _Var14._M_head_impl;
LAB_011cfc01:
        local_240 = (ulong)((int)local_240 - 1);
        uVar19 = (ulong)(uint)pIVar11[local_240].id;
        uVar10 = pIVar11[local_240].cond;
LAB_011cfc15:
        lVar15 = (long)(int)uVar19;
        while( true ) {
          pIVar3 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
          uVar24 = pIVar3[lVar15].out_opcode_;
          uVar8 = uVar24 & 7;
          iVar2 = (int)lVar15;
          if (uVar8 != 1) break;
          bVar7 = AddQ(&local_200,iVar2 + 1);
          lVar15 = lVar15 + 1;
          if (!bVar7) goto LAB_011cffb2;
        }
        uVar20 = (&switchD_011cfc52::switchdataD_0146f764)[uVar8];
        switch(uVar8) {
        case 0:
          local_1b0[0] = (new_allocator<duckdb_re2::InstCond>)0x0;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"unhandled opcode: ",0x12);
          std::ostream::operator<<(local_1a8,pIVar3[lVar15].out_opcode_ & 7);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          goto switchD_011cfc52_caseD_7;
        case 1:
          SparseSetT<void>::~SparseSetT(&local_200);
          SparseSetT<void>::~SparseSetT(&local_1d8);
          if (local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_228.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (__s != (int *)0x0) {
            operator_delete(__s);
          }
          if (pIVar11 != (InstCond *)0x0) {
            operator_delete(pIVar11);
          }
          _Unwind_Resume((long)&switchD_011cfc52::switchdataD_0146f764 + (long)(int)uVar20);
        case 2:
          iVar9 = __s[uVar24 >> 4];
          if (__s[uVar24 >> 4] == -1) {
            if ((int)lVar25 <= iVar17) goto LAB_011cffb2;
            AddQ(&local_1d8,uVar24 >> 4);
            __s[pIVar3[lVar15].out_opcode_ >> 4] = iVar17;
            local_1b0[0] = (new_allocator<duckdb_re2::InstCond>)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                      (&local_228,
                       (iterator)
                       local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,__n,
                       (value_type_conflict4 *)local_1b0);
            puVar26 = (uint *)(local_228.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_208);
            iVar9 = iVar17;
            iVar17 = iVar17 + 1;
          }
          bVar16 = pIVar3[lVar15].field_1.byte_range.lo_;
          uVar24 = (uint)bVar16;
          bVar13 = pIVar3[lVar15].field_1.byte_range.hi_;
          if (bVar16 <= bVar13) {
            uVar20 = iVar9 << 0x10 | uVar10;
            uVar8 = uVar20 | 0x40;
            if (!bVar27) {
              uVar8 = uVar20;
            }
            do {
              bVar16 = this->bytemap_[(int)uVar24];
              iVar21 = uVar24 - 1;
              lVar12 = (long)(int)uVar24;
              do {
                if (0xfe < lVar12) {
                  iVar21 = 0xff;
                  break;
                }
                iVar21 = iVar21 + 1;
                lVar6 = lVar12 + 1;
                lVar12 = lVar12 + 1;
              } while (this->bytemap_[lVar6] == bVar16);
              if ((~puVar26[(ulong)bVar16 + 1] & 0x30) == 0) {
                puVar26[(ulong)bVar16 + 1] = uVar8;
                bVar13 = pIVar3[lVar15].field_1.byte_range.hi_;
              }
              else if (puVar26[(ulong)bVar16 + 1] != uVar8) goto LAB_011cffb2;
              uVar24 = iVar21 + 1;
            } while (iVar21 < (int)(uint)bVar13);
          }
          if ((pIVar3[lVar15].field_1.out1_ & 0x10000) != 0) {
            bVar16 = pIVar3[lVar15].field_1.byte_range.lo_;
            if (bVar16 < 0x62) {
              bVar16 = 0x61;
            }
            if (0x79 < bVar13) {
              bVar13 = 0x7a;
            }
            if (bVar16 <= bVar13) {
              iVar21 = bVar16 - 0x20;
              uVar8 = iVar9 << 0x10 | uVar10;
              uVar24 = uVar8 | 0x40;
              if (!bVar27) {
                uVar24 = uVar8;
              }
              do {
                bVar16 = this->bytemap_[iVar21];
                iVar9 = 0xff;
                if (0xff < iVar21) {
                  iVar9 = iVar21;
                }
                iVar22 = iVar21 + -1;
                lVar12 = (long)iVar21;
                do {
                  iVar23 = iVar9;
                  if (0xfe < lVar12) break;
                  iVar22 = iVar22 + 1;
                  lVar6 = lVar12 + 1;
                  lVar12 = lVar12 + 1;
                  iVar23 = iVar22;
                } while (this->bytemap_[lVar6] == bVar16);
                if ((~puVar26[(ulong)bVar16 + 1] & 0x30) == 0) {
                  puVar26[(ulong)bVar16 + 1] = uVar24;
                }
                else if (puVar26[(ulong)bVar16 + 1] != uVar24) goto LAB_011cffb2;
                iVar21 = iVar23 + 1;
              } while (iVar23 < (int)(bVar13 - 0x20));
            }
          }
          if ((pIVar3[lVar15].out_opcode_ & 8) != 0) goto switchD_011cfc52_caseD_7;
          bVar7 = AddQ(&local_200,iVar2 + 1);
LAB_011cfeca:
          uVar19 = lVar15 + 1;
          if (bVar7 != false) goto LAB_011cfc15;
LAB_011cffb2:
          bVar27 = false;
          goto LAB_011d0013;
        default:
          if ((uVar24 & 8) == 0) {
            bVar7 = AddQ(&local_200,iVar2 + 1);
            if (bVar7) {
              lVar12 = (long)(int)local_240;
              pIVar11[lVar12].id = iVar2 + 1;
              local_240 = (ulong)((int)local_240 + 1);
              pIVar11[lVar12].cond = uVar10;
              uVar24 = pIVar3[lVar15].out_opcode_;
              goto LAB_011cfc94;
            }
LAB_011d005e:
            bVar27 = false;
            goto LAB_011d0013;
          }
LAB_011cfc94:
          if ((uVar24 & 7) == 4) {
            uVar10 = uVar10 | pIVar3[lVar15].field_1.out1_;
          }
          else if (((uVar24 & 7) == 3) && ((int)pIVar3[lVar15].field_1.byte_range < 10)) {
            uVar10 = uVar10 | 0x20 << (pIVar3[lVar15].field_1.byte_range.lo_ & 0x1f);
          }
          bVar7 = AddQ(&local_200,uVar24 >> 4);
          if (!bVar7) goto LAB_011d005e;
          uVar19 = (ulong)(pIVar3[lVar15].out_opcode_ >> 4);
          goto LAB_011cfc15;
        case 5:
          goto switchD_011cfc52_caseD_5;
        case 7:
          goto switchD_011cfc52_caseD_7;
        }
      }
    }
    bVar27 = false;
  }
  return bVar27;
switchD_011cfc52_caseD_5:
  if (bVar27) goto LAB_011cffb2;
  *puVar26 = uVar10;
  if ((uVar24 & 8) == 0) {
    bVar7 = AddQ(&local_200,iVar2 + 1);
    bVar27 = true;
    goto LAB_011cfeca;
  }
  bVar27 = true;
switchD_011cfc52_caseD_7:
  if ((int)local_240 < 1) goto LAB_011cff85;
  goto LAB_011cfc01;
LAB_011cff85:
  _Var14._M_head_impl = local_210 + 1;
  if (_Var14._M_head_impl ==
      local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t
      .super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1d8.size_) goto LAB_011cffbb;
  goto LAB_011cfb98;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(uint32_t) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}